

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall QTreeView::reset(QTreeView *this)

{
  long lVar1;
  
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear
            ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(lVar1 + 0x5d8));
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear
            ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(lVar1 + 0x5e8));
  QHash<QPersistentModelIndex,_QHashDummyValue>::clear
            ((QHash<QPersistentModelIndex,_QHashDummyValue> *)(lVar1 + 0x5f0));
  QList<QTreeViewItem>::clear((QList<QTreeViewItem> *)(lVar1 + 0x5a0));
  QAbstractItemView::reset((QAbstractItemView *)this);
  return;
}

Assistant:

void QTreeView::reset()
{
    Q_D(QTreeView);
    d->expandedIndexes.clear();
    d->hiddenIndexes.clear();
    d->spanningIndexes.clear();
    d->viewItems.clear();
    QAbstractItemView::reset();
}